

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O2

uint64_t Imf_3_4::anon_unknown_0::getBits(int nBits,uint64_t *c,int *lc,char **in)

{
  ulong uVar1;
  int iVar2;
  byte *pbVar3;
  
  iVar2 = *lc;
  uVar1 = *c;
  pbVar3 = (byte *)*in;
  while( true ) {
    if (nBits <= iVar2) break;
    *in = (char *)(pbVar3 + 1);
    uVar1 = uVar1 << 8 | (ulong)*pbVar3;
    *c = uVar1;
    iVar2 = iVar2 + 8;
    *lc = iVar2;
    pbVar3 = pbVar3 + 1;
  }
  *lc = iVar2 - nBits;
  return (ulong)((uint)(uVar1 >> ((byte)(iVar2 - nBits) & 0x3f)) & ~(-1 << ((byte)nBits & 0x1f)));
}

Assistant:

inline uint64_t
getBits (int nBits, uint64_t& c, int& lc, const char*& in)
{
    while (lc < nBits)
    {
        c = (c << 8) | *(unsigned char*) (in++);
        lc += 8;
    }

    lc -= nBits;
    return (c >> lc) & ((1 << nBits) - 1);
}